

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DeclaratorSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DeclaratorSyntax,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>const&,slang::syntax::EqualsValueClauseSyntax*&>
          (BumpAllocator *this,Token *args,
          SyntaxList<slang::syntax::VariableDimensionSyntax> *args_1,
          EqualsValueClauseSyntax **args_2)

{
  DeclaratorSyntax *pDVar1;
  size_t in_RCX;
  BumpAllocator *in_RDX;
  EqualsValueClauseSyntax *in_RSI;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *in_RDI;
  DeclaratorSyntax *unaff_retaddr;
  Token in_stack_00000008;
  size_t in_stack_ffffffffffffffd8;
  
  pDVar1 = (DeclaratorSyntax *)allocate(in_RDX,in_RCX,in_stack_ffffffffffffffd8);
  slang::syntax::DeclaratorSyntax::DeclaratorSyntax(unaff_retaddr,in_stack_00000008,in_RDI,in_RSI);
  return pDVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }